

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_collision_bench.cc
# Opt level: O1

void RandomCommand(char **s)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  
  iVar1 = rand();
  uVar4 = (uint)(((double)iVar1 / 2147483647.0) * 95.0 + 5.0 + 0.5);
  pcVar2 = (char *)operator_new__((long)(int)(uVar4 + 1));
  *s = pcVar2;
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      iVar1 = rand();
      (*s)[uVar3] = (char)(int)(((double)iVar1 / 2147483647.0) * 95.0 + 32.0 + 0.5);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  (*s)[(int)uVar4] = '\0';
  return;
}

Assistant:

void RandomCommand(char** s) {
  int len = random(5, 100);
  *s = new char[len+1];
  for (int i = 0; i < len; ++i)
    (*s)[i] = (char)random(32, 127);
  (*s)[len] = '\0';
}